

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == -0x10) {
      synchronize();
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        uv_rwlock_rdunlock(&rwlock);
        iVar1 = uv_rwlock_trywrlock(&rwlock);
        if (iVar1 == -0x10) {
          synchronize();
          iVar1 = uv_rwlock_trywrlock(&rwlock);
          if (iVar1 == 0) {
            synchronize();
            uv_rwlock_wrunlock(&rwlock);
            iVar1 = uv_rwlock_tryrdlock(&rwlock);
            if (iVar1 == 0) {
              synchronize();
              uv_rwlock_rdunlock(&rwlock);
              synchronize_nowait();
              uv_mutex_unlock(&mutex);
              return;
            }
            pcVar2 = "0 == uv_rwlock_tryrdlock(&rwlock)";
            uStack_10 = 0x82;
          }
          else {
            pcVar2 = "0 == uv_rwlock_trywrlock(&rwlock)";
            uStack_10 = 0x7d;
          }
        }
        else {
          pcVar2 = "UV_EBUSY == uv_rwlock_trywrlock(&rwlock)";
          uStack_10 = 0x79;
        }
      }
      else {
        pcVar2 = "0 == uv_rwlock_tryrdlock(&rwlock)";
        uStack_10 = 0x77;
      }
    }
    else {
      pcVar2 = "UV_EBUSY == uv_rwlock_trywrlock(&rwlock)";
      uStack_10 = 0x73;
    }
  }
  else {
    pcVar2 = "UV_EBUSY == uv_rwlock_tryrdlock(&rwlock)";
    uStack_10 = 0x72;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT(UV_EBUSY == uv_rwlock_tryrdlock(&rwlock));
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT(0 == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}